

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O2

string * __thiscall
Kernel::OperatorType::argsToString_abi_cxx11_(string *__return_storage_ptr__,OperatorType *this)

{
  uint uVar1;
  int iVar2;
  uint idx;
  char *__s;
  uint uVar3;
  TermList local_58;
  string local_50;
  
  uVar1 = this->_typeArgsArity;
  iVar2 = *(int *)this->_key;
  uVar3 = (uVar1 + iVar2) - 1;
  __s = "(";
  if (uVar3 < 2) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
  for (idx = this->_typeArgsArity; idx < uVar3; idx = idx + 1) {
    local_58 = arg(this,idx);
    TermList::toString_abi_cxx11_(&local_50,&local_58,false);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if ((iVar2 + uVar1) - 2 != idx) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string OperatorType::argsToString() const
{
  unsigned ar = arity();
  ASS(ar);
  std::string res = ar > 1 ? "(" : "";
  for (unsigned i = _typeArgsArity; i < ar; i++) {
    res += arg(i).toString();
    if (i != ar-1) {
      res += " * ";
    }
  }
  res += ar > 1 ? ")" : "";
  return res;
}